

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsestream.h
# Opt level: O0

int __thiscall embree::ParseStream::getInt(ParseStream *this)

{
  int iVar1;
  char *__nptr;
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_00000068;
  string local_28 [40];
  
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            (in_stack_00000068);
  __nptr = (char *)std::__cxx11::string::c_str();
  iVar1 = atoi(__nptr);
  std::__cxx11::string::~string(local_28);
  return iVar1;
}

Assistant:

int   getInt  () {
      return atoi(get().c_str());
    }